

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O1

void word_boundary(void)

{
  char *pcVar1;
  long lVar2;
  generator g;
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  string local_460 [8];
  string local_458 [8];
  string local_450 [8];
  string local_448 [8];
  string local_440 [8];
  string local_438 [8];
  string local_430 [8];
  string local_428 [8];
  string local_420 [8];
  int none1 [9];
  int word1 [9];
  int num1 [9];
  string all2 [1];
  int ideo1 [9];
  int kana1 [9];
  int word3 [8];
  int none3 [8];
  int zero [25];
  string all3 [8];
  string all1 [9];
  
  booster::locale::generator::generator(&g);
  all1[0]._M_dataplus._M_p = (pointer)&all1[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)all1,"10","");
  all1[1]._M_dataplus._M_p = (pointer)&all1[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all1 + 1)," ","");
  all1[2]._M_dataplus._M_p = (pointer)&all1[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all1 + 2),"Hello","");
  all1[3]._M_dataplus._M_p = (pointer)&all1[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all1 + 3)," ","");
  all1[4]._M_dataplus._M_p = (pointer)&all1[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all1 + 4),"Windows7","");
  all1[5]._M_dataplus._M_p = (pointer)&all1[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all1 + 5)," ","");
  all1[6]._M_dataplus._M_p = (pointer)&all1[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(all1 + 6),anon_var_dwarf_12a37,anon_var_dwarf_12a37 + 9);
  all1[7]._M_dataplus._M_p = (pointer)&all1[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(all1 + 7),anon_var_dwarf_12a51,anon_var_dwarf_12a51 + 9);
  all1[8]._M_dataplus._M_p = (pointer)&all1[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all1 + 8),"");
  none1[6] = 0;
  none1[7] = 0;
  none1[8] = 0;
  none1[0] = 0;
  none1[1] = 1;
  none1[2] = 0;
  none1[3] = 1;
  none1[4] = 0;
  none1[5] = 1;
  num1[2] = 0;
  num1[3] = 0;
  num1[6] = 0;
  num1[7] = 0;
  num1[8] = 0;
  num1[0] = 1;
  num1[1] = 0;
  num1[4] = 1;
  num1[5] = 0;
  word1[0] = 0;
  word1[1] = 0;
  word1[6] = 0;
  word1[7] = 0;
  word1[8] = 0;
  word1[2] = 1;
  word1[3] = 0;
  word1[4] = 1;
  word1[5] = 0;
  kana1[8] = 0;
  kana1[4] = 0;
  kana1[5] = 0;
  kana1[6] = 0;
  kana1[7] = 0;
  kana1[0] = 0;
  kana1[1] = 0;
  kana1[2] = 0;
  kana1[3] = 0;
  ideo1[4] = 0;
  ideo1[5] = 0;
  ideo1[0] = 0;
  ideo1[1] = 0;
  ideo1[2] = 0;
  ideo1[3] = 0;
  ideo1[6] = 1;
  ideo1[7] = 1;
  ideo1[8] = 1;
  zero[0x18] = 0;
  zero[0x14] = 0;
  zero[0x15] = 0;
  zero[0x16] = 0;
  zero[0x17] = 0;
  zero[0x10] = 0;
  zero[0x11] = 0;
  zero[0x12] = 0;
  zero[0x13] = 0;
  zero[0xc] = 0;
  zero[0xd] = 0;
  zero[0xe] = 0;
  zero[0xf] = 0;
  zero[8] = 0;
  zero[9] = 0;
  zero[10] = 0;
  zero[0xb] = 0;
  zero[4] = 0;
  zero[5] = 0;
  zero[6] = 0;
  zero[7] = 0;
  zero[0] = 0;
  zero[1] = 0;
  zero[2] = 0;
  zero[3] = 0;
  all2[0]._M_dataplus._M_p = (pointer)&all2[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)all2,"");
  all3[0]._M_dataplus._M_p = (pointer)&all3[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)all3," ","");
  all3[1]._M_dataplus._M_p = (pointer)&all3[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all3 + 1)," ","");
  all3[2]._M_dataplus._M_p = (pointer)&all3[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all3 + 2),"Hello","");
  all3[3]._M_dataplus._M_p = (pointer)&all3[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all3 + 3),",","");
  all3[4]._M_dataplus._M_p = (pointer)&all3[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all3 + 4),"World","");
  all3[5]._M_dataplus._M_p = (pointer)&all3[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all3 + 5),"!","");
  all3[6]._M_dataplus._M_p = (pointer)&all3[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all3 + 6)," ","");
  all3[7]._M_dataplus._M_p = (pointer)&all3[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(all3 + 7),"");
  none3[4] = 0;
  none3[5] = 1;
  none3[6] = 1;
  none3[7] = 0;
  none3[0] = 1;
  none3[1] = 1;
  none3[2] = 0;
  none3[3] = 1;
  word3[4] = 1;
  word3[5] = 0;
  word3[6] = 0;
  word3[7] = 0;
  word3[0] = 0;
  word3[1] = 0;
  word3[2] = 1;
  word3[3] = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," char UTF-8",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"ja_JP.UTF-8","");
  booster::locale::generator::generate(local_420);
  run_word<char>(all1,none1,num1,word1,kana1,ideo1,(locale *)local_420,word);
  std::locale::~locale((locale *)local_420);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"en_US.UTF-8","");
  booster::locale::generator::generate(local_428);
  run_word<char>(all2,zero,zero,zero,zero,zero,(locale *)local_428,word);
  std::locale::~locale((locale *)local_428);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"en_US.UTF-8","");
  booster::locale::generator::generate(local_430);
  run_word<char>(all3,none3,zero,word3,zero,zero,(locale *)local_430,word);
  std::locale::~locale((locale *)local_430);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," char Shift-JIS",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"ja_JP.Shift-JIS","");
  booster::locale::generator::generate(local_438);
  run_word<char>(all1,none1,num1,word1,kana1,ideo1,(locale *)local_438,word);
  std::locale::~locale((locale *)local_438);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"ja_JP.Shift-JIS","");
  booster::locale::generator::generate(local_440);
  run_word<char>(all2,zero,zero,zero,zero,zero,(locale *)local_440,word);
  std::locale::~locale((locale *)local_440);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"ja_JP.Shift-JIS","");
  booster::locale::generator::generate(local_448);
  run_word<char>(all3,none3,zero,word3,zero,zero,(locale *)local_448,word);
  std::locale::~locale((locale *)local_448);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," wchar_t",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"ja_JP.UTF-8","");
  booster::locale::generator::generate(local_450);
  run_word<wchar_t>(all1,none1,num1,word1,kana1,ideo1,(locale *)local_450,word);
  std::locale::~locale((locale *)local_450);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"en_US.UTF-8","");
  booster::locale::generator::generate(local_458);
  run_word<wchar_t>(all2,zero,zero,zero,zero,zero,(locale *)local_458,word);
  std::locale::~locale((locale *)local_458);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"en_US.UTF-8","");
  booster::locale::generator::generate(local_460);
  run_word<wchar_t>(all3,none3,zero,word3,zero,zero,(locale *)local_460,word);
  std::locale::~locale((locale *)local_460);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0]);
  }
  lVar2 = 0;
  do {
    pcVar1 = *(char **)((long)&all3[7]._M_dataplus._M_p + lVar2);
    if (all3[7].field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)all2[0]._M_dataplus._M_p != &all2[0].field_2) {
    operator_delete(all2[0]._M_dataplus._M_p);
  }
  lVar2 = 0;
  do {
    pcVar1 = *(char **)((long)&all1[8]._M_dataplus._M_p + lVar2);
    if (all1[8].field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x120);
  booster::locale::generator::~generator(&g);
  return;
}

Assistant:

void word_boundary()
{
    booster::locale::generator g;
    //std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","ひらがな","ヒラガナ",""};
    //std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","ひん","アヒル",""};
    std::string all1[]={"10"," ","Hello"," ","Windows7"," ","平仮名","アヒル",""};
    int        none1[]={ 0,   1,      0,  1,         0,   1,      0,         0,          0};
    int         num1[]={ 1,   0,      0,  0,         1,   0,      0 ,        0 ,         0};
    int        word1[]={ 0,   0,      1,  0,         1,   0,      0 ,        0 ,         0};
#if U_ICU_VERSION_MAJOR_NUM >= 50
    int        kana1[]={ 0,   0,      0,  0,         0,   0,      0,         0 ,         0}; 
    int        ideo1[]={ 0,   0,      0,  0,         0,   0,      1,         1 ,         1}; 
#else
    int        kana1[]={ 0,   0,      0,  0,         0,   0,      0,         1 ,         1}; 
    int        ideo1[]={ 0,   0,      0,  0,         0,   0,      1,         0 ,         0}; 
#endif


    int zero[25]={0};
    std::string all2[]={""};

    std::string all3[]={" "," ","Hello",",","World","!"," ",""};
    int        none3[]={ 1,  1,      0,  1,      0,   1,  1, 0};
    int        word3[]={ 0,  0,      1,  0,      1,   0,  0, 0};

    std::cout << " char UTF-8" << std::endl;
    run_word<char>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));

    std::cout << " char Shift-JIS" << std::endl;
    run_word<char>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.Shift-JIS"));
    run_word<char>(all2,zero,zero,zero,zero,zero,g("ja_JP.Shift-JIS"));
    run_word<char>(all3,none3,zero,word3,zero,zero,g("ja_JP.Shift-JIS"));

    std::cout << " wchar_t"<<std::endl;
    run_word<wchar_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<wchar_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<wchar_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));

    #ifdef BOOSTER_HAS_CHAR16_T
    std::cout << " char16_t"<<std::endl;
    run_word<char16_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char16_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char16_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));
    #endif 

    #ifdef BOOSTER_HAS_CHAR32_T
    std::cout << " char32_t"<<std::endl;
    run_word<char32_t>(all1,none1,num1,word1,kana1,ideo1,g("ja_JP.UTF-8"));
    run_word<char32_t>(all2,zero,zero,zero,zero,zero,g("en_US.UTF-8"));
    run_word<char32_t>(all3,none3,zero,word3,zero,zero,g("en_US.UTF-8"));
    #endif 
}